

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O3

void __thiscall AActor::Serialize(AActor *this,FSerializer *arc)

{
  BYTE *pBVar1;
  int iVar2;
  undefined4 extraout_var;
  FSerializer *pFVar4;
  TAngle<double> *pTVar5;
  TAngle<double> *pTVar6;
  DObject *v;
  AActor *local_38;
  PClass *pPVar3;
  
  pPVar3 = (this->super_DThinker).super_DObject.Class;
  if (pPVar3 == (PClass *)0x0) {
    iVar2 = (**(this->super_DThinker).super_DObject._vptr_DObject)(this);
    pPVar3 = (PClass *)CONCAT44(extraout_var,iVar2);
    (this->super_DThinker).super_DObject.Class = pPVar3;
  }
  pBVar1 = pPVar3->Defaults;
  DObject::Serialize((DObject *)this,arc);
  pFVar4 = FSerializer::Sprite(arc,"sprite",&this->sprite,(int32_t *)(pBVar1 + 0xf0));
  pTVar6 = (TAngle<double> *)0x0;
  pTVar5 = (TAngle<double> *)(pBVar1 + 0x48);
  if (save_full != false) {
    pTVar5 = pTVar6;
  }
  pFVar4 = FSerializer::Array<double>(pFVar4,"pos",&(this->__Pos).X,&pTVar5->Degrees,3,true);
  pTVar5 = (TAngle<double> *)(pBVar1 + 0xa8);
  if (save_full != false) {
    pTVar5 = pTVar6;
  }
  pFVar4 = FSerializer::Array<TAngle<double>>(pFVar4,"angles",&(this->Angles).Pitch,pTVar5,3,true);
  pTVar5 = (TAngle<double> *)(pBVar1 + 0xf4);
  if (save_full != false) {
    pTVar5 = pTVar6;
  }
  pFVar4 = ::Serialize(pFVar4,"frame",&this->frame,(uint8_t *)pTVar5);
  pTVar5 = (TAngle<double> *)(pBVar1 + 0xf8);
  if (save_full != false) {
    pTVar5 = pTVar6;
  }
  pFVar4 = FSerializer::Array<double>(pFVar4,"scale",&(this->Scale).X,&pTVar5->Degrees,2,true);
  pTVar5 = (TAngle<double> *)(pBVar1 + 0x108);
  if (save_full != false) {
    pTVar5 = pTVar6;
  }
  pFVar4 = FSerializer::Array<unsigned_char>
                     (pFVar4,"renderstyle",(uchar *)&(this->RenderStyle).AsDWORD,(uchar *)pTVar5,4,
                      false);
  pTVar5 = (TAngle<double> *)(pBVar1 + 0x10c);
  if (save_full != false) {
    pTVar5 = pTVar6;
  }
  pFVar4 = ::Serialize(pFVar4,"renderflags",&(this->renderflags).Value,(uint32_t *)pTVar5);
  pTVar5 = (TAngle<double> *)(pBVar1 + 0x110);
  if (save_full != false) {
    pTVar5 = pTVar6;
  }
  pFVar4 = ::Serialize(pFVar4,"picnum",&this->picnum,(FTextureID *)pTVar5);
  pTVar5 = (TAngle<double> *)(pBVar1 + 0x160);
  if (save_full != false) {
    pTVar5 = pTVar6;
  }
  pFVar4 = ::Serialize(pFVar4,"floorpic",&this->floorpic,(FTextureID *)pTVar5);
  pTVar5 = (TAngle<double> *)(pBVar1 + 0x170);
  if (save_full != false) {
    pTVar5 = pTVar6;
  }
  pFVar4 = ::Serialize(pFVar4,"ceilingpic",&this->ceilingpic,(FTextureID *)pTVar5);
  pTVar5 = (TAngle<double> *)(pBVar1 + 0x268);
  if (save_full != false) {
    pTVar5 = pTVar6;
  }
  pFVar4 = ::Serialize(pFVar4,"tidtohate",&this->TIDtoHate,(int32_t *)pTVar5);
  pTVar5 = (TAngle<double> *)(pBVar1 + 0x2d6);
  if (save_full != false) {
    pTVar5 = pTVar6;
  }
  pFVar4 = ::Serialize(pFVar4,"lastlookpn",&this->LastLookPlayerNumber,(int8_t *)pTVar5);
  ::Serialize(pFVar4,"lastlookactor",(DObject **)&this->LastLookActor,(DObject **)0x0,(bool *)0x0);
  pTVar5 = (TAngle<double> *)(pBVar1 + 0x114);
  if (save_full != false) {
    pTVar5 = pTVar6;
  }
  pFVar4 = ::Serialize(pFVar4,"effects",&this->effects,(uint32_t *)pTVar5);
  pTVar5 = (TAngle<double> *)(pBVar1 + 0x118);
  if (save_full != false) {
    pTVar5 = pTVar6;
  }
  pFVar4 = ::Serialize(pFVar4,"alpha",&this->Alpha,&pTVar5->Degrees);
  pTVar5 = (TAngle<double> *)(pBVar1 + 0x120);
  if (save_full != false) {
    pTVar5 = pTVar6;
  }
  pFVar4 = ::Serialize(pFVar4,"fillcolor",&this->fillcolor,(uint32_t *)pTVar5);
  pTVar5 = (TAngle<double> *)(pBVar1 + 0x130);
  if (save_full != false) {
    pTVar5 = pTVar6;
  }
  pFVar4 = Serialize<sector_t>(pFVar4,"sector",(sector_t_conflict **)&this->Sector,
                               (sector_t_conflict **)pTVar5);
  pTVar5 = (TAngle<double> *)(pBVar1 + 0x140);
  if (save_full != false) {
    pTVar5 = pTVar6;
  }
  pFVar4 = ::Serialize(pFVar4,"floorz",&this->floorz,&pTVar5->Degrees);
  pTVar5 = (TAngle<double> *)(pBVar1 + 0x148);
  if (save_full != false) {
    pTVar5 = pTVar6;
  }
  pFVar4 = ::Serialize(pFVar4,"ceilingz",&this->ceilingz,&pTVar5->Degrees);
  pTVar5 = (TAngle<double> *)(pBVar1 + 0x150);
  if (save_full != false) {
    pTVar5 = pTVar6;
  }
  pFVar4 = ::Serialize(pFVar4,"dropoffz",&this->dropoffz,&pTVar5->Degrees);
  pTVar5 = (TAngle<double> *)(pBVar1 + 0x158);
  if (save_full != false) {
    pTVar5 = pTVar6;
  }
  pFVar4 = Serialize<sector_t>(pFVar4,"floorsector",(sector_t_conflict **)&this->floorsector,
                               (sector_t_conflict **)pTVar5);
  pTVar5 = (TAngle<double> *)(pBVar1 + 0x168);
  if (save_full != false) {
    pTVar5 = pTVar6;
  }
  pFVar4 = Serialize<sector_t>(pFVar4,"ceilingsector",(sector_t_conflict **)&this->ceilingsector,
                               (sector_t_conflict **)pTVar5);
  pTVar5 = (TAngle<double> *)(pBVar1 + 0x178);
  if (save_full != false) {
    pTVar5 = pTVar6;
  }
  pFVar4 = ::Serialize(pFVar4,"radius",&this->radius,&pTVar5->Degrees);
  pTVar5 = (TAngle<double> *)(pBVar1 + 0x188);
  if (save_full != false) {
    pTVar5 = pTVar6;
  }
  pFVar4 = ::Serialize(pFVar4,"renderradius",&this->renderradius,&pTVar5->Degrees);
  pTVar5 = (TAngle<double> *)(pBVar1 + 0x180);
  if (save_full != false) {
    pTVar5 = pTVar6;
  }
  pFVar4 = ::Serialize(pFVar4,"height",&this->Height,&pTVar5->Degrees);
  pTVar5 = (TAngle<double> *)(pBVar1 + 400);
  if (save_full != false) {
    pTVar5 = pTVar6;
  }
  pFVar4 = ::Serialize(pFVar4,"ppassheight",&this->projectilepassheight,&pTVar5->Degrees);
  pTVar5 = (TAngle<double> *)(pBVar1 + 200);
  if (save_full != false) {
    pTVar5 = pTVar6;
  }
  pFVar4 = FSerializer::Array<double>(pFVar4,"vel",&(this->Vel).X,&pTVar5->Degrees,3,true);
  pTVar5 = (TAngle<double> *)(pBVar1 + 0x198);
  if (save_full != false) {
    pTVar5 = pTVar6;
  }
  pFVar4 = ::Serialize(pFVar4,"tics",&this->tics,(int32_t *)pTVar5);
  pTVar5 = (TAngle<double> *)(pBVar1 + 0x1a0);
  if (save_full != false) {
    pTVar5 = pTVar6;
  }
  pFVar4 = ::Serialize(pFVar4,"state",&this->state,(FState **)pTVar5,(bool *)0x0);
  pTVar5 = (TAngle<double> *)(pBVar1 + 0x1a8);
  if (save_full != false) {
    pTVar5 = pTVar6;
  }
  pFVar4 = ::Serialize(pFVar4,"damage",&this->DamageVal,(int32_t *)pTVar5);
  pFVar4 = FSerializer::Terrain(pFVar4,"floorterrain",&this->floorterrain,(int *)(pBVar1 + 0x164));
  pTVar5 = (TAngle<double> *)(pBVar1 + 0x1b8);
  if (save_full != false) {
    pTVar5 = pTVar6;
  }
  pFVar4 = ::Serialize(pFVar4,"projectilekickback",&this->projectileKickback,(int32_t *)pTVar5);
  pTVar5 = (TAngle<double> *)(pBVar1 + 0x1bc);
  if (save_full != false) {
    pTVar5 = pTVar6;
  }
  pFVar4 = ::Serialize(pFVar4,"flags",&(this->flags).Value,(uint32_t *)pTVar5);
  pTVar5 = (TAngle<double> *)(pBVar1 + 0x1c0);
  if (save_full != false) {
    pTVar5 = pTVar6;
  }
  pFVar4 = ::Serialize(pFVar4,"flags2",&(this->flags2).Value,(uint32_t *)pTVar5);
  pTVar5 = (TAngle<double> *)(pBVar1 + 0x1c4);
  if (save_full != false) {
    pTVar5 = pTVar6;
  }
  pFVar4 = ::Serialize(pFVar4,"flags3",&(this->flags3).Value,(uint32_t *)pTVar5);
  pTVar5 = (TAngle<double> *)(pBVar1 + 0x1c8);
  if (save_full != false) {
    pTVar5 = pTVar6;
  }
  pFVar4 = ::Serialize(pFVar4,"flags4",&(this->flags4).Value,(uint32_t *)pTVar5);
  pTVar5 = (TAngle<double> *)(pBVar1 + 0x1cc);
  if (save_full != false) {
    pTVar5 = pTVar6;
  }
  pFVar4 = ::Serialize(pFVar4,"flags5",&(this->flags5).Value,(uint32_t *)pTVar5);
  pTVar5 = (TAngle<double> *)(pBVar1 + 0x1d0);
  if (save_full != false) {
    pTVar5 = pTVar6;
  }
  pFVar4 = ::Serialize(pFVar4,"flags6",&(this->flags6).Value,(uint32_t *)pTVar5);
  pTVar5 = (TAngle<double> *)(pBVar1 + 0x1d4);
  if (save_full != false) {
    pTVar5 = pTVar6;
  }
  pFVar4 = ::Serialize(pFVar4,"flags7",&(this->flags7).Value,(uint32_t *)pTVar5);
  pTVar5 = (TAngle<double> *)(pBVar1 + 0x1f8);
  if (save_full != false) {
    pTVar5 = pTVar6;
  }
  pFVar4 = ::Serialize(pFVar4,"weaponspecial",&this->weaponspecial,(int32_t *)pTVar5);
  pTVar5 = (TAngle<double> *)(pBVar1 + 0x1dc);
  if (save_full != false) {
    pTVar5 = pTVar6;
  }
  pFVar4 = ::Serialize(pFVar4,"special1",&this->special1,(int32_t *)pTVar5);
  pTVar5 = (TAngle<double> *)(pBVar1 + 0x1e0);
  if (save_full != false) {
    pTVar5 = pTVar6;
  }
  pFVar4 = ::Serialize(pFVar4,"special2",&this->special2,(int32_t *)pTVar5);
  pTVar5 = (TAngle<double> *)(pBVar1 + 0x1e8);
  if (save_full != false) {
    pTVar5 = pTVar6;
  }
  pFVar4 = ::Serialize(pFVar4,"specialf1",&this->specialf1,&pTVar5->Degrees);
  pTVar5 = (TAngle<double> *)(pBVar1 + 0x1f0);
  if (save_full != false) {
    pTVar5 = pTVar6;
  }
  pFVar4 = ::Serialize(pFVar4,"specialf2",&this->specialf2,&pTVar5->Degrees);
  pTVar5 = (TAngle<double> *)(pBVar1 + 0x1fc);
  if (save_full != false) {
    pTVar5 = pTVar6;
  }
  pFVar4 = ::Serialize(pFVar4,"health",&this->health,(int32_t *)pTVar5);
  pTVar5 = (TAngle<double> *)(pBVar1 + 0x200);
  if (save_full != false) {
    pTVar5 = pTVar6;
  }
  pFVar4 = ::Serialize(pFVar4,"movedir",&this->movedir,(uint8_t *)pTVar5);
  pTVar5 = (TAngle<double> *)(pBVar1 + 0x201);
  if (save_full != false) {
    pTVar5 = pTVar6;
  }
  pFVar4 = ::Serialize(pFVar4,"visdir",&this->visdir,(int8_t *)pTVar5);
  pTVar5 = (TAngle<double> *)(pBVar1 + 0x202);
  if (save_full != false) {
    pTVar5 = pTVar6;
  }
  pFVar4 = ::Serialize(pFVar4,"movecount",&this->movecount,(int16_t *)pTVar5);
  pTVar5 = (TAngle<double> *)(pBVar1 + 0x204);
  if (save_full != false) {
    pTVar5 = pTVar6;
  }
  pFVar4 = ::Serialize(pFVar4,"strafecount",&this->strafecount,(int16_t *)pTVar5);
  ::Serialize(pFVar4,"target",(DObject **)&this->target,(DObject **)0x0,(bool *)0x0);
  ::Serialize(pFVar4,"lastenemy",(DObject **)&this->lastenemy,(DObject **)0x0,(bool *)0x0);
  ::Serialize(pFVar4,"lastheard",(DObject **)&this->LastHeard,(DObject **)0x0,(bool *)0x0);
  pTVar5 = (TAngle<double> *)(pBVar1 + 0x220);
  if (save_full != false) {
    pTVar5 = pTVar6;
  }
  pFVar4 = ::Serialize(pFVar4,"reactiontime",&this->reactiontime,(int32_t *)pTVar5);
  pTVar5 = (TAngle<double> *)(pBVar1 + 0x224);
  if (save_full != false) {
    pTVar5 = pTVar6;
  }
  pFVar4 = ::Serialize(pFVar4,"threshold",&this->threshold,(int32_t *)pTVar5);
  pTVar5 = (TAngle<double> *)(pBVar1 + 0x230);
  if (save_full != false) {
    pTVar5 = pTVar6;
  }
  pFVar4 = Serialize<player_t>(pFVar4,"player",&this->player,(player_t **)pTVar5);
  pTVar5 = (TAngle<double> *)(pBVar1 + 0x240);
  if (save_full != false) {
    pTVar5 = pTVar6;
  }
  pFVar4 = FSerializer::Array<double>
                     (pFVar4,"spawnpoint",&(this->SpawnPoint).X,&pTVar5->Degrees,3,true);
  pTVar5 = (TAngle<double> *)(pBVar1 + 600);
  if (save_full != false) {
    pTVar5 = pTVar6;
  }
  pFVar4 = ::Serialize(pFVar4,"spawnangle",&this->SpawnAngle,(uint16_t *)pTVar5);
  pTVar5 = (TAngle<double> *)(pBVar1 + 0x25c);
  if (save_full != false) {
    pTVar5 = pTVar6;
  }
  pFVar4 = ::Serialize(pFVar4,"starthealth",&this->StartHealth,(int32_t *)pTVar5);
  pTVar5 = (TAngle<double> *)(pBVar1 + 0x264);
  if (save_full != false) {
    pTVar5 = pTVar6;
  }
  pFVar4 = ::Serialize(pFVar4,"skillrespawncount",&this->skillrespawncount,(int32_t *)pTVar5);
  ::Serialize(pFVar4,"tracer",(DObject **)&this->tracer,(DObject **)0x0,(bool *)0x0);
  pTVar5 = (TAngle<double> *)(pBVar1 + 0x288);
  if (save_full != false) {
    pTVar5 = pTVar6;
  }
  pFVar4 = ::Serialize(pFVar4,"floorclip",&this->Floorclip,&pTVar5->Degrees);
  pTVar5 = (TAngle<double> *)(pBVar1 + 0x290);
  if (save_full != false) {
    pTVar5 = pTVar6;
  }
  pFVar4 = ::Serialize(pFVar4,"tid",&this->tid,(int32_t *)pTVar5);
  pTVar5 = (TAngle<double> *)(pBVar1 + 0x294);
  if (save_full != false) {
    pTVar5 = pTVar6;
  }
  pFVar4 = ::Serialize(pFVar4,"special",&this->special,(int32_t *)pTVar5);
  pFVar4 = FSerializer::Args(pFVar4,"args",this->args,(int *)(pBVar1 + 0x298),this->special);
  pTVar5 = (TAngle<double> *)(pBVar1 + 0x2ac);
  if (save_full != false) {
    pTVar5 = pTVar6;
  }
  pFVar4 = ::Serialize(pFVar4,"accuracy",&this->accuracy,(int32_t *)pTVar5);
  pTVar5 = (TAngle<double> *)(pBVar1 + 0x2b0);
  if (save_full != false) {
    pTVar5 = pTVar6;
  }
  pFVar4 = ::Serialize(pFVar4,"stamina",&this->stamina,(int32_t *)pTVar5);
  ::Serialize(pFVar4,"goal",(DObject **)&this->goal,(DObject **)0x0,(bool *)0x0);
  pTVar5 = (TAngle<double> *)(pBVar1 + 0x2d0);
  if (save_full != false) {
    pTVar5 = pTVar6;
  }
  pFVar4 = ::Serialize(pFVar4,"waterlevel",&this->waterlevel,(int32_t *)pTVar5);
  pTVar5 = (TAngle<double> *)(pBVar1 + 0x2d5);
  if (save_full != false) {
    pTVar5 = pTVar6;
  }
  pFVar4 = ::Serialize(pFVar4,"minmissilechance",&this->MinMissileChance,(uint8_t *)pTVar5);
  pTVar5 = (TAngle<double> *)(pBVar1 + 0x2dc);
  if (save_full != false) {
    pTVar5 = pTVar6;
  }
  pFVar4 = ::Serialize(pFVar4,"spawnflags",&this->SpawnFlags,(uint32_t *)pTVar5);
  ::Serialize(pFVar4,"inventory",(DObject **)&this->Inventory,(DObject **)0x0,(bool *)0x0);
  pTVar5 = (TAngle<double> *)(pBVar1 + 0x3b8);
  if (save_full != false) {
    pTVar5 = pTVar6;
  }
  pFVar4 = ::Serialize(pFVar4,"inventoryid",&this->InventoryID,(uint32_t *)pTVar5);
  pTVar5 = (TAngle<double> *)(pBVar1 + 0x3bd);
  if (save_full != false) {
    pTVar5 = pTVar6;
  }
  pFVar4 = ::Serialize(pFVar4,"floatbobphase",&this->FloatBobPhase,(uint8_t *)pTVar5);
  pTVar5 = (TAngle<double> *)(pBVar1 + 0x3c0);
  if (save_full != false) {
    pTVar5 = pTVar6;
  }
  pFVar4 = ::Serialize(pFVar4,"translation",&this->Translation,(uint32_t *)pTVar5);
  pTVar5 = (TAngle<double> *)(pBVar1 + 0x3c4);
  if (save_full != false) {
    pTVar5 = pTVar6;
  }
  pFVar4 = ::Serialize(pFVar4,"seesound",&(this->SeeSound).super_FSoundID,(FSoundID *)pTVar5);
  pTVar5 = (TAngle<double> *)(pBVar1 + 0x3c8);
  if (save_full != false) {
    pTVar5 = pTVar6;
  }
  pFVar4 = ::Serialize(pFVar4,"attacksound",&(this->AttackSound).super_FSoundID,(FSoundID *)pTVar5);
  pTVar5 = (TAngle<double> *)(pBVar1 + 0x3cc);
  if (save_full != false) {
    pTVar5 = pTVar6;
  }
  pFVar4 = ::Serialize(pFVar4,"paimsound",&(this->PainSound).super_FSoundID,(FSoundID *)pTVar5);
  pTVar5 = (TAngle<double> *)(pBVar1 + 0x3d0);
  if (save_full != false) {
    pTVar5 = pTVar6;
  }
  pFVar4 = ::Serialize(pFVar4,"deathsound",&(this->DeathSound).super_FSoundID,(FSoundID *)pTVar5);
  pTVar5 = (TAngle<double> *)(pBVar1 + 0x3d4);
  if (save_full != false) {
    pTVar5 = pTVar6;
  }
  pFVar4 = ::Serialize(pFVar4,"activesound",&(this->ActiveSound).super_FSoundID,(FSoundID *)pTVar5);
  pTVar5 = (TAngle<double> *)(pBVar1 + 0x3d8);
  if (save_full != false) {
    pTVar5 = pTVar6;
  }
  pFVar4 = ::Serialize(pFVar4,"usesound",&(this->UseSound).super_FSoundID,(FSoundID *)pTVar5);
  pTVar5 = (TAngle<double> *)(pBVar1 + 0x3dc);
  if (save_full != false) {
    pTVar5 = pTVar6;
  }
  pFVar4 = ::Serialize(pFVar4,"bouncesound",&(this->BounceSound).super_FSoundID,(FSoundID *)pTVar5);
  pTVar5 = (TAngle<double> *)(pBVar1 + 0x3e0);
  if (save_full != false) {
    pTVar5 = pTVar6;
  }
  pFVar4 = ::Serialize(pFVar4,"wallbouncesound",&(this->WallBounceSound).super_FSoundID,
                       (FSoundID *)pTVar5);
  pTVar5 = (TAngle<double> *)(pBVar1 + 0x3e4);
  if (save_full != false) {
    pTVar5 = pTVar6;
  }
  pFVar4 = ::Serialize(pFVar4,"crushpainsound",&(this->CrushPainSound).super_FSoundID,
                       (FSoundID *)pTVar5);
  pTVar5 = (TAngle<double> *)(pBVar1 + 0xe0);
  if (save_full != false) {
    pTVar5 = pTVar6;
  }
  pFVar4 = ::Serialize(pFVar4,"speed",&this->Speed,&pTVar5->Degrees);
  pTVar5 = (TAngle<double> *)(pBVar1 + 0xe8);
  if (save_full != false) {
    pTVar5 = pTVar6;
  }
  pFVar4 = ::Serialize(pFVar4,"floatspeed",&this->FloatSpeed,&pTVar5->Degrees);
  pTVar5 = (TAngle<double> *)(pBVar1 + 0x3f8);
  if (save_full != false) {
    pTVar5 = pTVar6;
  }
  pFVar4 = ::Serialize(pFVar4,"mass",&this->Mass,(int32_t *)pTVar5);
  pTVar5 = (TAngle<double> *)(pBVar1 + 0x3fc);
  if (save_full != false) {
    pTVar5 = pTVar6;
  }
  pFVar4 = ::Serialize(pFVar4,"painchance",&this->PainChance,(int16_t *)pTVar5);
  pTVar5 = (TAngle<double> *)(pBVar1 + 0x448);
  if (save_full != false) {
    pTVar5 = pTVar6;
  }
  pFVar4 = ::Serialize(pFVar4,"spawnstate",&this->SpawnState,(FState **)pTVar5,(bool *)0x0);
  pTVar5 = (TAngle<double> *)(pBVar1 + 0x450);
  if (save_full != false) {
    pTVar5 = pTVar6;
  }
  pFVar4 = ::Serialize(pFVar4,"seestate",&this->SeeState,(FState **)pTVar5,(bool *)0x0);
  pTVar5 = (TAngle<double> *)(pBVar1 + 0x458);
  if (save_full != false) {
    pTVar5 = pTVar6;
  }
  pFVar4 = ::Serialize(pFVar4,"meleestate",&this->MeleeState,(FState **)pTVar5,(bool *)0x0);
  pTVar5 = (TAngle<double> *)(pBVar1 + 0x460);
  if (save_full != false) {
    pTVar5 = pTVar6;
  }
  pFVar4 = ::Serialize(pFVar4,"missilestate",&this->MissileState,(FState **)pTVar5,(bool *)0x0);
  pTVar5 = (TAngle<double> *)(pBVar1 + 1000);
  if (save_full != false) {
    pTVar5 = pTVar6;
  }
  pFVar4 = ::Serialize(pFVar4,"maxdropoffheight",&this->MaxDropOffHeight,&pTVar5->Degrees);
  pTVar5 = (TAngle<double> *)(pBVar1 + 0x3f0);
  if (save_full != false) {
    pTVar5 = pTVar6;
  }
  pFVar4 = ::Serialize(pFVar4,"maxstepheight",&this->MaxStepHeight,&pTVar5->Degrees);
  pTVar5 = (TAngle<double> *)(pBVar1 + 0x2d8);
  if (save_full != false) {
    pTVar5 = pTVar6;
  }
  pFVar4 = ::Serialize(pFVar4,"bounceflags",&(this->BounceFlags).Value,(uint16_t *)pTVar5);
  pTVar5 = (TAngle<double> *)(pBVar1 + 0x2f8);
  if (save_full != false) {
    pTVar5 = pTVar6;
  }
  pFVar4 = ::Serialize(pFVar4,"bouncefactor",&this->bouncefactor,&pTVar5->Degrees);
  pTVar5 = (TAngle<double> *)(pBVar1 + 0x300);
  if (save_full != false) {
    pTVar5 = pTVar6;
  }
  pFVar4 = ::Serialize(pFVar4,"wallbouncefactor",&this->wallbouncefactor,&pTVar5->Degrees);
  pTVar5 = (TAngle<double> *)(pBVar1 + 0x308);
  if (save_full != false) {
    pTVar5 = pTVar6;
  }
  pFVar4 = ::Serialize(pFVar4,"bouncecount",&this->bouncecount,(int32_t *)pTVar5);
  pTVar5 = (TAngle<double> *)(pBVar1 + 0x2f0);
  if (save_full != false) {
    pTVar5 = pTVar6;
  }
  pFVar4 = ::Serialize(pFVar4,"maxtargetrange",&this->maxtargetrange,&pTVar5->Degrees);
  pTVar5 = (TAngle<double> *)(pBVar1 + 0x2e8);
  if (save_full != false) {
    pTVar5 = pTVar6;
  }
  pFVar4 = ::Serialize(pFVar4,"meleethreshold",&this->meleethreshold,&pTVar5->Degrees);
  pTVar5 = (TAngle<double> *)(pBVar1 + 0x2e0);
  if (save_full != false) {
    pTVar5 = pTVar6;
  }
  pFVar4 = ::Serialize(pFVar4,"meleerange",&this->meleerange,&pTVar5->Degrees);
  pTVar5 = (TAngle<double> *)(pBVar1 + 0x404);
  if (save_full != false) {
    pTVar5 = pTVar6;
  }
  pFVar4 = ::Serialize(pFVar4,"damagetype",&(this->DamageType).super_FName,(FName *)pTVar5);
  pTVar5 = (TAngle<double> *)(pBVar1 + 0x408);
  if (save_full != false) {
    pTVar5 = pTVar6;
  }
  pFVar4 = ::Serialize(pFVar4,"damagetypereceived",&(this->DamageTypeReceived).super_FName,
                       (FName *)pTVar5);
  pTVar5 = (TAngle<double> *)(pBVar1 + 0x420);
  if (save_full != false) {
    pTVar5 = pTVar6;
  }
  pFVar4 = ::Serialize(pFVar4,"paintype",&(this->PainType).super_FName,(FName *)pTVar5);
  pTVar5 = (TAngle<double> *)(pBVar1 + 0x424);
  if (save_full != false) {
    pTVar5 = pTVar6;
  }
  pFVar4 = ::Serialize(pFVar4,"deathtype",&(this->DeathType).super_FName,(FName *)pTVar5);
  pTVar5 = (TAngle<double> *)(pBVar1 + 0x310);
  if (save_full != false) {
    pTVar5 = pTVar6;
  }
  pFVar4 = ::Serialize(pFVar4,"gravity",&this->Gravity,&pTVar5->Degrees);
  pTVar5 = (TAngle<double> *)(pBVar1 + 800);
  if (save_full != false) {
    pTVar5 = pTVar6;
  }
  pFVar4 = ::Serialize(pFVar4,"fastchasestrafecount",&this->FastChaseStrafeCount,(int32_t *)pTVar5);
  ::Serialize(pFVar4,"master",(DObject **)&this->master,(DObject **)0x0,(bool *)0x0);
  pTVar5 = (TAngle<double> *)(pBVar1 + 0x3bc);
  if (save_full != false) {
    pTVar5 = pTVar6;
  }
  pFVar4 = ::Serialize(pFVar4,"smokecounter",&this->smokecounter,(uint8_t *)pTVar5);
  local_38 = this->BlockingMobj;
  ::Serialize(pFVar4,"blockingmobj",(DObject **)&local_38,(DObject **)0x0,(bool *)0x0);
  this->BlockingMobj = local_38;
  pTVar5 = (TAngle<double> *)(pBVar1 + 0x358);
  if (save_full != false) {
    pTVar5 = pTVar6;
  }
  pFVar4 = Serialize<line_t>(pFVar4,"blockingline",(line_t_conflict **)&this->BlockingLine,
                             (line_t_conflict **)pTVar5);
  pTVar5 = (TAngle<double> *)(pBVar1 + 0x1d8);
  if (save_full != false) {
    pTVar5 = pTVar6;
  }
  pFVar4 = ::Serialize(pFVar4,"visibletoteam",&this->VisibleToTeam,(uint32_t *)pTVar5);
  pTVar5 = (TAngle<double> *)(pBVar1 + 0x328);
  if (save_full != false) {
    pTVar5 = pTVar6;
  }
  pFVar4 = ::Serialize(pFVar4,"pushfactor",&this->pushfactor,&pTVar5->Degrees);
  pTVar5 = (TAngle<double> *)(pBVar1 + 0x26c);
  if (save_full != false) {
    pTVar5 = pTVar6;
  }
  pFVar4 = ::Serialize(pFVar4,"species",&(this->Species).super_FName,(FName *)pTVar5);
  pTVar5 = (TAngle<double> *)(pBVar1 + 0x33c);
  if (save_full != false) {
    pTVar5 = pTVar6;
  }
  pFVar4 = ::Serialize(pFVar4,"score",&this->Score,(int32_t *)pTVar5);
  pTVar5 = (TAngle<double> *)(pBVar1 + 0x348);
  if (save_full != false) {
    pTVar5 = pTVar6;
  }
  pFVar4 = ::Serialize(pFVar4,"designatedteam",&this->DesignatedTeam,(int32_t *)pTVar5);
  pTVar5 = (TAngle<double> *)(pBVar1 + 0x330);
  if (save_full != false) {
    pTVar5 = pTVar6;
  }
  pFVar4 = ::Serialize(pFVar4,"lastpush",&this->lastpush,(int32_t *)pTVar5);
  pTVar5 = (TAngle<double> *)(pBVar1 + 0x338);
  if (save_full != false) {
    pTVar5 = pTVar6;
  }
  pFVar4 = ::Serialize(pFVar4,"lastbump",&this->lastbump,(int32_t *)pTVar5);
  pTVar5 = (TAngle<double> *)(pBVar1 + 0x400);
  if (save_full != false) {
    pTVar5 = pTVar6;
  }
  pFVar4 = ::Serialize(pFVar4,"painthreshold",&this->PainThreshold,(int32_t *)pTVar5);
  pTVar5 = (TAngle<double> *)(pBVar1 + 0x410);
  if (save_full != false) {
    pTVar5 = pTVar6;
  }
  pFVar4 = ::Serialize(pFVar4,"damagefactor",&this->DamageFactor,&pTVar5->Degrees);
  pTVar5 = (TAngle<double> *)(pBVar1 + 0x418);
  if (save_full != false) {
    pTVar5 = pTVar6;
  }
  pFVar4 = ::Serialize(pFVar4,"damagemultiply",&this->DamageMultiply,&pTVar5->Degrees);
  pTVar5 = (TAngle<double> *)(pBVar1 + 0x260);
  if (save_full != false) {
    pTVar5 = pTVar6;
  }
  pFVar4 = ::Serialize(pFVar4,"waveindexxy",&this->WeaveIndexXY,(uint8_t *)pTVar5);
  pTVar5 = (TAngle<double> *)(pBVar1 + 0x261);
  if (save_full != false) {
    pTVar5 = pTVar6;
  }
  pFVar4 = ::Serialize(pFVar4,"weaveindexz",&this->WeaveIndexZ,(uint8_t *)pTVar5);
  pTVar5 = (TAngle<double> *)(pBVar1 + 0x370);
  if (save_full != false) {
    pTVar5 = pTVar6;
  }
  pFVar4 = ::Serialize(pFVar4,"pdmgreceived",&this->PoisonDamageReceived,(int32_t *)pTVar5);
  pTVar5 = (TAngle<double> *)(pBVar1 + 0x378);
  if (save_full != false) {
    pTVar5 = pTVar6;
  }
  pFVar4 = ::Serialize(pFVar4,"pdurreceived",&this->PoisonDurationReceived,(int32_t *)pTVar5);
  pTVar5 = (TAngle<double> *)(pBVar1 + 0x37c);
  if (save_full != false) {
    pTVar5 = pTVar6;
  }
  pFVar4 = ::Serialize(pFVar4,"ppreceived",&this->PoisonPeriodReceived,(int32_t *)pTVar5);
  ::Serialize(pFVar4,"poisoner",(DObject **)&this->Poisoner,(DObject **)0x0,(bool *)0x0);
  pTVar5 = (TAngle<double> *)(pBVar1 + 0x360);
  if (save_full != false) {
    pTVar5 = pTVar6;
  }
  pFVar4 = ::Serialize(pFVar4,"posiondamage",&this->PoisonDamage,(int32_t *)pTVar5);
  pTVar5 = (TAngle<double> *)(pBVar1 + 0x368);
  if (save_full != false) {
    pTVar5 = pTVar6;
  }
  pFVar4 = ::Serialize(pFVar4,"poisonduration",&this->PoisonDuration,(int32_t *)pTVar5);
  pTVar5 = (TAngle<double> *)(pBVar1 + 0x36c);
  if (save_full != false) {
    pTVar5 = pTVar6;
  }
  pFVar4 = ::Serialize(pFVar4,"poisonperiod",&this->PoisonPeriod,(int32_t *)pTVar5);
  pTVar5 = (TAngle<double> *)(pBVar1 + 0x364);
  if (save_full != false) {
    pTVar5 = pTVar6;
  }
  pFVar4 = ::Serialize(pFVar4,"poisondamagetype",&(this->PoisonDamageType).super_FName,
                       (FName *)pTVar5);
  pTVar5 = (TAngle<double> *)(pBVar1 + 0x374);
  if (save_full != false) {
    pTVar5 = pTVar6;
  }
  pFVar4 = ::Serialize(pFVar4,"poisondmgtypereceived",&(this->PoisonDamageTypeReceived).super_FName,
                       (FName *)pTVar5);
  pTVar5 = (TAngle<double> *)(pBVar1 + 0x468);
  if (save_full != false) {
    pTVar5 = pTVar6;
  }
  pFVar4 = ::Serialize(pFVar4,"conversationroot",&this->ConversationRoot,(int32_t *)pTVar5);
  pTVar5 = (TAngle<double> *)(pBVar1 + 0x470);
  if (save_full != false) {
    pTVar5 = pTVar6;
  }
  pFVar4 = Serialize<FStrifeDialogueNode>
                     (pFVar4,"conversation",&this->Conversation,(FStrifeDialogueNode **)pTVar5);
  pTVar5 = (TAngle<double> *)(pBVar1 + 0x3be);
  if (save_full != false) {
    pTVar5 = pTVar6;
  }
  pFVar4 = ::Serialize(pFVar4,"friendplayer",&this->FriendPlayer,(uint8_t *)pTVar5);
  pTVar5 = (TAngle<double> *)(pBVar1 + 0x428);
  if (save_full != false) {
    pTVar5 = pTVar6;
  }
  pFVar4 = Serialize<PClassActor>
                     (pFVar4,"telefogsourcetype",&this->TeleFogSourceType,(PClassActor **)pTVar5);
  pTVar5 = (TAngle<double> *)(pBVar1 + 0x430);
  if (save_full != false) {
    pTVar5 = pTVar6;
  }
  pFVar4 = Serialize<PClassActor>
                     (pFVar4,"telefogdesttype",&this->TeleFogDestType,(PClassActor **)pTVar5);
  pTVar5 = (TAngle<double> *)(pBVar1 + 0x438);
  if (save_full != false) {
    pTVar5 = pTVar6;
  }
  pFVar4 = ::Serialize(pFVar4,"ripperlevel",&this->RipperLevel,(int32_t *)pTVar5);
  pTVar5 = (TAngle<double> *)(pBVar1 + 0x43c);
  if (save_full != false) {
    pTVar5 = pTVar6;
  }
  pFVar4 = ::Serialize(pFVar4,"riplevelmin",&this->RipLevelMin,(int32_t *)pTVar5);
  pTVar5 = (TAngle<double> *)(pBVar1 + 0x440);
  if (save_full != false) {
    pTVar5 = pTVar6;
  }
  pFVar4 = ::Serialize(pFVar4,"riplevelmax",&this->RipLevelMax,(int32_t *)pTVar5);
  pTVar5 = (TAngle<double> *)(pBVar1 + 0x228);
  if (save_full != false) {
    pTVar5 = pTVar6;
  }
  pFVar4 = ::Serialize(pFVar4,"devthreshold",&this->DefThreshold,(int32_t *)pTVar5);
  pTVar5 = (TAngle<double> *)(pBVar1 + 0x78);
  if (save_full != false) {
    pTVar5 = pTVar6;
  }
  pFVar4 = ::Serialize(pFVar4,"spriteangle",&(this->SpriteAngle).Degrees,&pTVar5->Degrees);
  pTVar5 = (TAngle<double> *)(pBVar1 + 0x80);
  if (save_full != false) {
    pTVar5 = pTVar6;
  }
  pFVar4 = ::Serialize(pFVar4,"spriterotation",&(this->SpriteRotation).Degrees,&pTVar5->Degrees);
  ::Serialize(pFVar4,"alternative",(DObject **)&this->alternative,(DObject **)0x0,(bool *)0x0);
  pTVar5 = (TAngle<double> *)(pBVar1 + 0x340);
  if (save_full != false) {
    pTVar5 = pTVar6;
  }
  pFVar4 = Serialize<FString>(pFVar4,"tag",&this->Tag,(FString **)pTVar5);
  pTVar5 = (TAngle<double> *)(pBVar1 + 0x88);
  if (save_full != false) {
    pTVar5 = pTVar6;
  }
  pFVar4 = ::Serialize(pFVar4,"visiblestartangle",&(this->VisibleStartAngle).Degrees,
                       &pTVar5->Degrees);
  pTVar5 = (TAngle<double> *)(pBVar1 + 0x98);
  if (save_full != false) {
    pTVar5 = pTVar6;
  }
  pFVar4 = ::Serialize(pFVar4,"visibleendangle",&(this->VisibleEndAngle).Degrees,&pTVar5->Degrees);
  pTVar5 = (TAngle<double> *)(pBVar1 + 0x90);
  if (save_full != false) {
    pTVar5 = pTVar6;
  }
  pFVar4 = ::Serialize(pFVar4,"visiblestartpitch",&(this->VisibleStartPitch).Degrees,
                       &pTVar5->Degrees);
  pTVar5 = (TAngle<double> *)(pBVar1 + 0xa0);
  if (save_full != false) {
    pTVar5 = pTVar6;
  }
  ::Serialize(pFVar4,"visibleendpitch",&(this->VisibleEndPitch).Degrees,&pTVar5->Degrees);
  return;
}

Assistant:

void AActor::Serialize(FSerializer &arc)
{
	AActor *def = GetDefault();

	Super::Serialize(arc);

	arc
		.Sprite("sprite", sprite, &def->sprite)
		A("pos", __Pos)
		A("angles", Angles)
		A("frame", frame)
		A("scale", Scale)
		A("renderstyle", RenderStyle)
		A("renderflags", renderflags)
		A("picnum", picnum)
		A("floorpic", floorpic)
		A("ceilingpic", ceilingpic)
		A("tidtohate", TIDtoHate)
		A("lastlookpn", LastLookPlayerNumber)
		("lastlookactor", LastLookActor)
		A("effects", effects)
		A("alpha", Alpha)
		A("fillcolor", fillcolor)
		A("sector", Sector)
		A("floorz", floorz)
		A("ceilingz", ceilingz)
		A("dropoffz", dropoffz)
		A("floorsector", floorsector)
		A("ceilingsector", ceilingsector)
		A("radius", radius)
		A("renderradius", renderradius)
		A("height", Height)
		A("ppassheight", projectilepassheight)
		A("vel", Vel)
		A("tics", tics)
		A("state", state)
		A("damage", DamageVal)
		.Terrain("floorterrain", floorterrain, &def->floorterrain)
		A("projectilekickback", projectileKickback)
		A("flags", flags)
		A("flags2", flags2)
		A("flags3", flags3)
		A("flags4", flags4)
		A("flags5", flags5)
		A("flags6", flags6)
		A("flags7", flags7)
		A("weaponspecial", weaponspecial)
		A("special1", special1)
		A("special2", special2)
		A("specialf1", specialf1)
		A("specialf2", specialf2)
		A("health", health)
		A("movedir", movedir)
		A("visdir", visdir)
		A("movecount", movecount)
		A("strafecount", strafecount)
		("target", target)
		("lastenemy", lastenemy)
		("lastheard", LastHeard)
		A("reactiontime", reactiontime)
		A("threshold", threshold)
		A("player", player)
		A("spawnpoint", SpawnPoint)
		A("spawnangle", SpawnAngle)
		A("starthealth", StartHealth)
		A("skillrespawncount", skillrespawncount)
		("tracer", tracer)
		A("floorclip", Floorclip)
		A("tid", tid)
		A("special", special)
		.Args("args", args, def->args, special)
		A("accuracy", accuracy)
		A("stamina", stamina)
		("goal", goal)
		A("waterlevel", waterlevel)
		A("minmissilechance", MinMissileChance)
		A("spawnflags", SpawnFlags)
		("inventory", Inventory)
		A("inventoryid", InventoryID)
		A("floatbobphase", FloatBobPhase)
		A("translation", Translation)
		A("seesound", SeeSound)
		A("attacksound", AttackSound)
		A("paimsound", PainSound)
		A("deathsound", DeathSound)
		A("activesound", ActiveSound)
		A("usesound", UseSound)
		A("bouncesound", BounceSound)
		A("wallbouncesound", WallBounceSound)
		A("crushpainsound", CrushPainSound)
		A("speed", Speed)
		A("floatspeed", FloatSpeed)
		A("mass", Mass)
		A("painchance", PainChance)
		A("spawnstate", SpawnState)
		A("seestate", SeeState)
		A("meleestate", MeleeState)
		A("missilestate", MissileState)
		A("maxdropoffheight", MaxDropOffHeight)
		A("maxstepheight", MaxStepHeight)
		A("bounceflags", BounceFlags)
		A("bouncefactor", bouncefactor)
		A("wallbouncefactor", wallbouncefactor)
		A("bouncecount", bouncecount)
		A("maxtargetrange", maxtargetrange)
		A("meleethreshold", meleethreshold)
		A("meleerange", meleerange)
		A("damagetype", DamageType)
		A("damagetypereceived", DamageTypeReceived)
		A("paintype", PainType)
		A("deathtype", DeathType)
		A("gravity", Gravity)
		A("fastchasestrafecount", FastChaseStrafeCount)
		("master", master)
		A("smokecounter", smokecounter)
		("blockingmobj", BlockingMobj)
		A("blockingline", BlockingLine)
		A("visibletoteam", VisibleToTeam)
		A("pushfactor", pushfactor)
		A("species", Species)
		A("score", Score)
		A("designatedteam", DesignatedTeam)
		A("lastpush", lastpush)
		A("lastbump", lastbump)
		A("painthreshold", PainThreshold)
		A("damagefactor", DamageFactor)
		A("damagemultiply", DamageMultiply)
		A("waveindexxy", WeaveIndexXY)
		A("weaveindexz", WeaveIndexZ)
		A("pdmgreceived", PoisonDamageReceived)
		A("pdurreceived", PoisonDurationReceived)
		A("ppreceived", PoisonPeriodReceived)
		("poisoner", Poisoner)
		A("posiondamage", PoisonDamage)
		A("poisonduration", PoisonDuration)
		A("poisonperiod", PoisonPeriod)
		A("poisondamagetype", PoisonDamageType)
		A("poisondmgtypereceived", PoisonDamageTypeReceived)
		A("conversationroot", ConversationRoot)
		A("conversation", Conversation)
		A("friendplayer", FriendPlayer)
		A("telefogsourcetype", TeleFogSourceType)
		A("telefogdesttype", TeleFogDestType)
		A("ripperlevel", RipperLevel)
		A("riplevelmin", RipLevelMin)
		A("riplevelmax", RipLevelMax)
		A("devthreshold", DefThreshold)
		A("spriteangle", SpriteAngle)
		A("spriterotation", SpriteRotation)
		("alternative", alternative)
		A("tag", Tag)
		A("visiblestartangle",VisibleStartAngle)
		A("visibleendangle",VisibleEndAngle)
		A("visiblestartpitch",VisibleStartPitch)
		A("visibleendpitch",VisibleEndPitch);
}